

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

int cmCommandExists(void *arg,char *name)

{
  cmState *this;
  cmCommand *pcVar1;
  allocator local_39;
  string local_38;
  
  this = cmMakefile::GetState((cmMakefile *)arg);
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  pcVar1 = cmState::GetCommand(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (int)(pcVar1 != (cmCommand *)0x0);
}

Assistant:

int CCONV cmCommandExists(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  return static_cast<int>(mf->GetState()->GetCommand(name) ? 1 : 0);
}